

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

Result __thiscall wabt::WastParser::ParseModuleFieldList(WastParser *this,Module *module)

{
  TokenType TVar1;
  TokenType TVar2;
  Result RVar3;
  _func_int **pp_Var4;
  Func *func;
  FuncDeclaration *decl;
  ModuleField *pMVar5;
  bool bVar6;
  ExprVisitor local_90;
  Delegate local_40;
  ResolveFuncTypesExprVisitorDelegate delegate;
  
  TVar1 = Peek(this,0);
  TVar2 = Peek(this,1);
  while (((TVar1 == Lpar && (TVar2 < First_Literal)) &&
         ((0x2c008dd800U >> ((ulong)TVar2 & 0x3f) & 1) != 0))) {
    RVar3 = ParseModuleField(this,module);
    if ((RVar3.enum_ == Error) &&
       (RVar3 = Synchronize(this,anon_unknown_1::IsModuleField), RVar3.enum_ == Error)) {
      return (Result)Error;
    }
    TVar1 = Peek(this,0);
    TVar2 = Peek(this,1);
  }
  pMVar5 = (module->fields).first_;
  if (pMVar5 != (ModuleField *)0x0) {
    do {
      if (pMVar5->type_ == Import) {
        pp_Var4 = pMVar5[1]._vptr_ModuleField;
        if (*(int *)(pp_Var4 + 9) != 0) {
          pp_Var4 = (_func_int **)0x0;
        }
        decl = (FuncDeclaration *)(pp_Var4 + 0xe);
        bVar6 = pp_Var4 != (_func_int **)0x0;
        if (!bVar6) {
          decl = (FuncDeclaration *)0x0;
        }
        func = (Func *)0x0;
      }
      else if (pMVar5->type_ == Func) {
        func = (Func *)(pMVar5 + 1);
        decl = (FuncDeclaration *)&pMVar5[1].loc.filename.size_;
        bVar6 = true;
      }
      else {
        decl = (FuncDeclaration *)0x0;
        func = (Func *)0x0;
        bVar6 = false;
      }
      if (bVar6) {
        if (decl != (FuncDeclaration *)0x0) {
          anon_unknown_1::ResolveFuncTypeWithEmptySignature(module,decl);
          anon_unknown_1::ResolveImplicitlyDefinedFunctionType(&pMVar5->loc,module,decl);
        }
        if (func != (Func *)0x0) {
          local_40._vptr_Delegate = (_func_int **)&PTR__Delegate_0155d9a8;
          delegate.super_DelegateNop.super_Delegate._vptr_Delegate = (Delegate)(Delegate)module;
          ExprVisitor::ExprVisitor(&local_90,&local_40);
          ExprVisitor::VisitFunc(&local_90,func);
          if (local_90.expr_iter_stack_.
              super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_90.expr_iter_stack_.
                            super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                            ._M_impl.super__Vector_impl_data._M_start);
          }
          if (local_90.expr_stack_.super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_90.expr_stack_.
                            super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          if (local_90.state_stack_.
              super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_90.state_stack_.
                            super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                            ._M_impl.super__Vector_impl_data._M_start);
          }
        }
      }
      pMVar5 = (pMVar5->super_intrusive_list_base<wabt::ModuleField>).next_;
    } while (pMVar5 != (ModuleField *)0x0);
  }
  return (Result)Ok;
}

Assistant:

Result WastParser::ParseModuleFieldList(Module* module) {
  WABT_TRACE(ParseModuleFieldList);
  while (IsModuleField(PeekPair())) {
    if (Failed(ParseModuleField(module))) {
      CHECK_RESULT(Synchronize(IsModuleField));
    }
  }
  ResolveFuncTypes(module);
  return Result::Ok;
}